

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Agent.cpp
# Opt level: O1

size_t RVO::linearProgram2(vector<RVO::Line,_std::allocator<RVO::Line>_> *lines,float radius,
                          Vector2 *optVelocity,bool directionOpt,Vector2 *result)

{
  Vector2 VVar1;
  bool bVar2;
  pointer pLVar3;
  undefined7 in_register_00000011;
  size_t sVar4;
  long lVar5;
  bool bVar6;
  float fVar7;
  float fVar8;
  size_t local_40;
  
  fVar8 = optVelocity->x_;
  if ((int)CONCAT71(in_register_00000011,directionOpt) == 0) {
    fVar7 = fVar8 * fVar8 + optVelocity->y_ * optVelocity->y_;
    if (fVar7 <= radius * radius) {
      *result = *optVelocity;
      goto LAB_00106d46;
    }
    if (fVar7 < 0.0) {
      fVar7 = sqrtf(fVar7);
    }
    else {
      fVar7 = SQRT(fVar7);
    }
    fVar8 = optVelocity->x_ * (1.0 / fVar7);
    fVar7 = (1.0 / fVar7) * optVelocity->y_;
  }
  else {
    fVar7 = optVelocity->y_;
  }
  VVar1.y_ = fVar7 * radius;
  VVar1.x_ = fVar8 * radius;
  *result = VVar1;
LAB_00106d46:
  pLVar3 = (lines->super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>)._M_impl.
           super__Vector_impl_data._M_start;
  bVar6 = (lines->super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>)._M_impl.
          super__Vector_impl_data._M_finish != pLVar3;
  if (bVar6) {
    lVar5 = 0xc;
    sVar4 = 0;
    do {
      if (0.0 < (*(float *)((long)pLVar3 + lVar5 + -8) - result->y_) *
                *(float *)((long)pLVar3 + lVar5 + -4) -
                (*(float *)((long)pLVar3 + lVar5 + -0xc) - result->x_) *
                *(float *)((long)&(pLVar3->point).x_ + lVar5)) {
        VVar1 = *result;
        bVar2 = linearProgram1(lines,sVar4,radius,optVelocity,directionOpt,result);
        if (!bVar2) {
          *result = VVar1;
          local_40 = sVar4;
          break;
        }
      }
      sVar4 = sVar4 + 1;
      pLVar3 = (lines->super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar5 = lVar5 + 0x10;
      bVar6 = sVar4 < (ulong)((long)(lines->
                                    super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>).
                                    _M_impl.super__Vector_impl_data._M_finish - (long)pLVar3 >> 4);
    } while (bVar6);
  }
  sVar4 = (long)(lines->super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(lines->super__Vector_base<RVO::Line,_std::allocator<RVO::Line>_>)._M_impl.
                super__Vector_impl_data._M_start >> 4;
  if (bVar6) {
    sVar4 = local_40;
  }
  return sVar4;
}

Assistant:

size_t linearProgram2(const std::vector<Line> &lines, float radius, const Vector2 &optVelocity, bool directionOpt, Vector2 &result)
	{
		if (directionOpt) {
			/*
			 * Optimize direction. Note that the optimization velocity is of unit
			 * length in this case.
			 */
			result = optVelocity * radius;
		}
		else if (absSq(optVelocity) > sqr(radius)) {
			/* Optimize closest point and outside circle. */
			result = normalize(optVelocity) * radius;
		}
		else {
			/* Optimize closest point and inside circle. */
			result = optVelocity;
		}

		for (size_t i = 0; i < lines.size(); ++i) {
			if (det(lines[i].direction, lines[i].point - result) > 0.0f) {
				/* Result does not satisfy constraint i. Compute new optimal result. */
				const Vector2 tempResult = result;

				if (!linearProgram1(lines, i, radius, optVelocity, directionOpt, result)) {
					result = tempResult;
					return i;
				}
			}
		}

		return lines.size();
	}